

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_ULong FT_Stream_ReadUOffset(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  ulong uVar2;
  byte *pbVar3;
  byte local_23 [8];
  FT_Byte reads [3];
  
  *error = 0;
  uVar1 = stream->pos;
  if (stream->size <= uVar1 + 2) {
LAB_001ef342:
    *error = 0x55;
    return 0;
  }
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->base == (uchar *)0x0) {
      uVar2 = 0;
      goto LAB_001ef375;
    }
    pbVar3 = stream->base + uVar1;
  }
  else {
    pbVar3 = local_23;
    uVar1 = (*stream->read)(stream,uVar1,pbVar3,3);
    if (uVar1 != 3) goto LAB_001ef342;
    uVar1 = stream->pos;
  }
  uVar2 = (ulong)pbVar3[2] | (ulong)((uint)pbVar3[1] << 8 | (uint)*pbVar3 << 0x10);
LAB_001ef375:
  stream->pos = uVar1 + 3;
  return uVar2;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_ReadUOffset( FT_Stream  stream,
                         FT_Error*  error )
  {
    FT_Byte   reads[3];
    FT_Byte*  p      = 0;
    FT_ULong  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->pos + 2 < stream->size )
    {
      if ( stream->read )
      {
        if (stream->read( stream, stream->pos, reads, 3L ) != 3L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_UOFF3( p );
    }
    else
      goto Fail;

    stream->pos += 3;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadUOffset:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }